

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

void __thiscall cmAlphaNum::cmAlphaNum(cmAlphaNum *this,int val)

{
  uint uVar1;
  
  (this->View_)._M_len = 0;
  (this->View_)._M_str = (char *)0x0;
  uVar1 = snprintf(this->Digits_,0x20,"%i",val);
  if (uVar1 - 1 < 0x1f) {
    (this->View_)._M_len = (ulong)uVar1;
    (this->View_)._M_str = this->Digits_;
  }
  return;
}

Assistant:

cmAlphaNum::cmAlphaNum(int val)
{
  MakeDigits(this->View_, this->Digits_, "%i", val);
}